

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryCommand::cmFindLibraryCommand(cmFindLibraryCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"find_library",&local_31);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_30,status);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_00856198;
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).EnvironmentPath);
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  (this->super_cmFindBase).VariableType = FILEPATH;
  return;
}

Assistant:

cmFindLibraryCommand::cmFindLibraryCommand(cmExecutionStatus& status)
  : cmFindBase("find_library", status)
{
  this->EnvironmentPath = "LIB";
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a library.";
  this->VariableType = cmStateEnums::FILEPATH;
}